

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

xml_node * xml_easy_child(xml_node *node,uint8_t *child_name,...)

{
  char in_AL;
  _Bool _Var1;
  size_t sVar2;
  xml_node *pxVar3;
  undefined8 *puVar4;
  undefined8 in_RCX;
  undefined8 *puVar5;
  ulong uVar6;
  undefined8 in_RDX;
  uint uVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t child;
  xml_node *pxVar8;
  bool bVar9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arguments;
  xml_string cn;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  uVar7 = 0x10;
  puVar5 = (undefined8 *)&stack0x00000008;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    if (child_name == (uint8_t *)0x0) {
      return node;
    }
    cn.buffer = child_name;
    cn.length = strlen((char *)child_name);
    sVar2 = xml_node_children(node);
    pxVar8 = (xml_node *)0x0;
    for (child = 0; sVar2 != child; child = child + 1) {
      pxVar3 = xml_node_child(node,child);
      _Var1 = xml_string_equals(pxVar3->name,&cn);
      if ((_Var1) && (bVar9 = pxVar8 != (xml_node *)0x0, pxVar8 = pxVar3, bVar9)) {
        return (xml_node *)0x0;
      }
    }
    if (pxVar8 == (xml_node *)0x0) {
      return (xml_node *)0x0;
    }
    if (uVar7 < 0x29) {
      uVar6 = (ulong)uVar7;
      uVar7 = uVar7 + 8;
      puVar4 = puVar5;
      puVar5 = (undefined8 *)((long)local_e8 + uVar6);
    }
    else {
      puVar4 = puVar5 + 1;
    }
    child_name = (uint8_t *)*puVar5;
    puVar5 = puVar4;
    node = pxVar8;
  } while( true );
}

Assistant:

struct xml_node* xml_easy_child(struct xml_node* node, uint8_t const* child_name, ...) {

	/* Find children, one by one
	 */
	struct xml_node* current = node;

	va_list arguments;
	va_start(arguments, child_name);


	/* Descent to current.child
	 */
	while (child_name) {

		/* Convert child_name to xml_string for easy comparison
		 */
		struct xml_string cn = {
			.buffer = child_name,
			.length = strlen(child_name)
		};

		/* Interate through all children
		 */
		struct xml_node* next = 0;

		size_t i = 0; for (; i < xml_node_children(current); ++i) {
			struct xml_node* child = xml_node_child(current, i);

			if (xml_string_equals(xml_node_name(child), &cn)) {
				if (!next) {
					next = child;

				/* Two children with the same name
				 */
				} else {
					va_end(arguments);
					return 0;
				}
			}
		}

		/* No child with that name found
		 */
		if (!next) {
			va_end(arguments);
			return 0;
		}
		current = next;		
		
		/* Find name of next child
		 */
		child_name = va_arg(arguments, uint8_t const*);
	}
	va_end(arguments);


	/* Return current element
	 */
	return current;
}